

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O1

int ptls_load_pem_objects
              (char *pem_fname,char *label,ptls_iovec_t *list,size_t list_max,size_t *nb_objects)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  ptls_buffer_t buf;
  char line [256];
  size_t local_190;
  ptls_buffer_t local_188;
  size_t *local_160;
  ptls_iovec_t *local_158;
  size_t local_150;
  ptls_base64_decode_state_t local_148;
  char local_138 [264];
  
  local_158 = list;
  __stream = fopen(pem_fname,"r");
  local_190 = 0;
  *nb_objects = 0;
  local_160 = nb_objects;
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
  }
  else if (list_max == 0) {
    iVar1 = 0;
  }
  else {
    local_190 = 0;
    local_150 = list_max;
    do {
      local_188.base = "";
      local_188.capacity = 0;
      local_188.off = 0;
      local_188._24_8_ = local_188._24_8_ & 0xffffffffffff0000;
      do {
        pcVar3 = fgets(local_138,0x100,__stream);
        if (pcVar3 == (char *)0x0) {
          iVar1 = 0x233;
          goto LAB_00130a28;
        }
        iVar1 = ptls_compare_separator_line(local_138,"BEGIN",label);
      } while (iVar1 != 0);
      local_148.nbc = 0;
      local_148.nbo = 3;
      local_148.status = 1;
      local_148.v = 0;
      iVar1 = 0;
LAB_00130a28:
      if (pcVar3 != (char *)0x0) {
        while( true ) {
          pcVar3 = fgets(local_138,0x100,__stream);
          iVar1 = 0;
          if (pcVar3 == (char *)0x0) break;
          iVar1 = ptls_compare_separator_line(local_138,"END",label);
          if (iVar1 == 0) {
            iVar1 = 0;
            if (local_148.status != 0) {
              iVar1 = 0x232;
              if (local_148.status == 1 && local_148.nbc == 0) {
                iVar1 = 0;
              }
            }
            break;
          }
          iVar1 = ptls_base64_decode(local_138,&local_148,&local_188);
          if (iVar1 != 0) break;
        }
      }
      if (((iVar1 == 0) && (local_188.off != 0)) && (local_188.is_allocated != '\0')) {
        local_158[local_190].base = local_188.base;
        local_158[local_190].len = local_188.off;
        local_190 = local_190 + 1;
      }
      else {
        ptls_buffer__release_memory(&local_188);
        local_188.off = 0;
        local_188.is_allocated = '\0';
        local_188.align_bits = '\0';
        local_188._26_6_ = 0;
        local_188.base = (uint8_t *)0x0;
        local_188.capacity = 0;
      }
    } while ((iVar1 == 0) && (local_190 < local_150));
  }
  *local_160 = local_190;
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  iVar2 = 0;
  if (local_190 == 0) {
    iVar2 = iVar1;
  }
  if (iVar1 != 0x233) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int ptls_load_pem_objects(char const *pem_fname, const char *label, ptls_iovec_t *list, size_t list_max, size_t *nb_objects)
{
    FILE *F;
    int ret = 0;
    size_t count = 0;
#ifdef _WINDOWS
    errno_t err = fopen_s(&F, pem_fname, "r");
    if (err != 0) {
        ret = -1;
    }
#else
    F = fopen(pem_fname, "r");
    if (F == NULL) {
        ret = -1;
    }
#endif

    *nb_objects = 0;

    if (ret == 0) {
        while (count < list_max) {
            ptls_buffer_t buf;

            ptls_buffer_init(&buf, "", 0);

            ret = ptls_get_pem_object(F, label, &buf);

            if (ret == 0) {
                if (buf.off > 0 && buf.is_allocated) {
                    list[count].base = buf.base;
                    list[count].len = buf.off;
                    count++;
                } else {
                    ptls_buffer_dispose(&buf);
                }
            } else {
                ptls_buffer_dispose(&buf);
                break;
            }
        }
    }

    if (ret == PTLS_ERROR_PEM_LABEL_NOT_FOUND && count > 0) {
        ret = 0;
    }

    *nb_objects = count;

    if (F != NULL) {
        fclose(F);
    }

    return ret;
}